

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BasicCopyTexImageCubeCase::createTexture(BasicCopyTexImageCubeCase *this)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TextureFormat TVar6;
  Context *pCVar7;
  NotSupportedError *this_00;
  int i;
  long lVar8;
  bool bVar9;
  int width;
  ContextWrapper *this_01;
  deUint32 tex;
  BasicCopyTexImageCubeCase *local_1c8;
  int local_1bc;
  Vec4 local_1b8;
  Vec4 local_1a8;
  Random rnd;
  GradientShader shader;
  
  iVar1 = (*((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var,iVar1);
  bVar9 = false;
  if ((0 < *(int *)(lVar8 + 8)) && (bVar9 = false, 0 < *(int *)(lVar8 + 0xc))) {
    bVar9 = 0 < *(int *)(lVar8 + 0x10);
  }
  local_1bc = *(int *)(lVar8 + 0x14);
  TVar6 = mapGLUnsizedInternalFormat(this->m_internalFormat);
  tex = 0;
  dVar2 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_01 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  local_1c8 = this;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_01);
  dVar2 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&shader);
  if ((TVar6.order == A || bVar9) &&
     ((RGBA < TVar6.order || (0xedU >> ((byte)TVar6.order & 0x1f) & 1) != 0) || 0 < local_1bc)) {
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_01);
    local_1b8.m_data[0] = 0.0;
    local_1b8.m_data[1] = 0.0;
    local_1b8.m_data[2] = 0.0;
    local_1b8.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      local_1a8.m_data[lVar8] = 1.0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    FboTestUtil::GradientShader::setGradient(&shader,pCVar7,dVar2,&local_1b8,&local_1a8);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_01);
    local_1b8.m_data[0] = -1.0;
    local_1b8.m_data[1] = -1.0;
    local_1b8.m_data._8_8_ = local_1b8.m_data._8_8_ & 0xffffffff00000000;
    local_1a8.m_data._0_8_ = &DAT_3f8000003f800000;
    local_1a8.m_data[2] = 0.0;
    sglr::drawQuad(pCVar7,dVar2,(Vec3 *)&local_1b8,(Vec3 *)&local_1a8);
    sglr::ContextWrapper::glGenTextures(this_01,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_01,0x8513,tex);
    if (0 < (local_1c8->super_TextureCubeSpecCase).m_numLevels) {
      iVar1 = 0;
      do {
        width = (local_1c8->super_TextureCubeSpecCase).m_size >> ((byte)iVar1 & 0x1f);
        if (width < 2) {
          width = 1;
        }
        lVar8 = 0;
        do {
          iVar3 = sglr::ContextWrapper::getWidth(this_01);
          dVar2 = deRandom_getUint32(&rnd.m_rnd);
          iVar4 = sglr::ContextWrapper::getHeight(this_01);
          dVar5 = deRandom_getUint32(&rnd.m_rnd);
          sglr::ContextWrapper::glCopyTexImage2D
                    (this_01,*(deUint32 *)((long)&s_cubeMapFaces + lVar8),iVar1,
                     local_1c8->m_internalFormat,dVar2 % ((iVar3 - width) + 1U),
                     dVar5 % ((iVar4 - width) + 1U),width,width,0);
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x18);
        iVar1 = iVar1 + 1;
      } while (iVar1 < (local_1c8->super_TextureCubeSpecCase).m_numLevels);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x78f);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= mapGLUnsizedInternalFormat(m_internalFormat);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int x = rnd.getInt(0, getWidth()	- levelSize);
				int y = rnd.getInt(0, getHeight()	- levelSize);

				glCopyTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, x, y, levelSize, levelSize, 0);
			}
		}
	}